

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::set(option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,string *value)

{
  exception *e;
  string local_40 [32];
  string *local_20;
  string *value_local;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = value;
  value_local = (string *)this;
  (*(this->super_option_base)._vptr_option_base[0xc])(local_40,this,value);
  std::__cxx11::string::operator=((string *)&this->actual,local_40);
  std::__cxx11::string::~string(local_40);
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value){
                        try
                        {
                            actual = read(value);
                            has = true;
                        }
                        catch(
                        const std::exception
                        &e){
                            return false;
                        }
                        return true;
                    }